

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_inflateZLIBInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  long lVar1;
  uint uVar2;
  ktx_uint32_t kVar3;
  void *__src;
  uchar *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar4;
  ktx_size_t paddedLevelByteLength;
  ktx_error_code_e result;
  size_t levelByteLength;
  int32_t level;
  ktx_size_t inflatedByteLength;
  ktx_uint32_t uncompressedLevelAlignment;
  ktxLevelIndexEntry *nindex;
  ktxLevelIndexEntry *cindex;
  uint64_t levelOffset;
  ktx_uint32_t levelIndexByteLength;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  uchar *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  ktx_error_code_e in_stack_ffffffffffffff94;
  uchar *puVar5;
  int local_5c;
  uchar *local_58;
  uchar *local_38;
  uchar *local_28;
  ktx_error_code_e local_4;
  
  uVar2 = *(int *)(in_RDI + 0x34) * 0x18;
  local_38 = (uchar *)0x0;
  lVar1 = *(long *)(in_RDI + 0xa0);
  if (in_RSI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (in_RDX == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (*(int *)(in_RDI + 0x88) == 3) {
    __src = malloc((ulong)uVar2);
    if (__src == (void *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar3 = ktxTexture2_calcPostInflationLevelAlignment
                        ((ktxTexture2 *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      local_58 = (uchar *)0x0;
      local_5c = *(int *)(in_RDI + 0x34);
      local_28 = in_RCX;
      while (local_5c = local_5c + -1, -1 < local_5c) {
        puVar5 = local_28;
        in_stack_ffffffffffffff94 =
             ktxUncompressZLIBInt
                       (local_28,(ktx_size_t *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88,
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (in_stack_ffffffffffffff94 != KTX_SUCCESS) {
          free(__src);
          return in_stack_ffffffffffffff94;
        }
        if (*(uchar **)(*(long *)(in_RDI + 0xa0) + (long)local_5c * 0x18 + 0x30) != puVar5) {
          free(__src);
          return KTX_DECOMPRESS_LENGTH_ERROR;
        }
        *(uchar **)((long)__src + (long)local_5c * 0x18) = local_38;
        *(uchar **)((long)__src + (long)local_5c * 0x18 + 8) = puVar5;
        *(uchar **)((long)__src + (long)local_5c * 0x18 + 0x10) = puVar5;
        in_stack_ffffffffffffff80 = (float)(long)puVar5;
        in_stack_ffffffffffffff84 = (float)puVar5;
        fVar4 = ceilf(in_stack_ffffffffffffff84 / (float)kVar3);
        in_stack_ffffffffffffff88 = (uchar *)((long)((float)kVar3 * fVar4) & 0xffffffff);
        local_58 = in_stack_ffffffffffffff88 + (long)local_58;
        local_38 = in_stack_ffffffffffffff88 + (long)local_38;
        local_28 = local_28 + -(long)in_stack_ffffffffffffff88;
      }
      *(uchar **)(in_RDI + 0x68) = local_58;
      *(undefined4 *)(in_RDI + 0x88) = 0;
      memcpy((void *)(lVar1 + 0x20),__src,(ulong)uVar2);
      free(__src);
      *(ktx_uint32_t *)(*(long *)(in_RDI + 0xa0) + 8) = kVar3;
      local_4 = KTX_SUCCESS;
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZLIBInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint32_t uncompressedLevelAlignment;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength = inflatedDataCapacity;
        KTX_error_code result = ktxUncompressZLIBInt(pInflatedData + levelOffset,
                                                    &levelByteLength,
                                                    &pDeflatedData[cindex[level].byteOffset],
                                                    cindex[level].byteLength);
        if (result != KTX_SUCCESS) {
            free(nindex);
            return result;
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            free(nindex);
            return KTX_DECOMPRESS_LENGTH_ERROR;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(nindex);
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

    return KTX_SUCCESS;
}